

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Timing.cpp
# Opt level: O3

void __thiscall soul::ScopedTimer::~ScopedTimer(ScopedTimer *this)

{
  pointer pcVar1;
  bool bVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  double __x;
  long *local_50 [2];
  long local_40 [2];
  ScopedTimer *local_30;
  undefined8 local_28;
  code *local_20;
  code *local_18;
  
  bVar2 = Logger::isLoggingEnabled();
  if (bVar2) {
    pcVar1 = (this->description)._M_dataplus._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + (this->description)._M_string_length);
    local_28 = 0;
    local_18 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_Timing.cpp:40:5)>
               ::_M_invoke;
    local_20 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/diagnostics/soul_Timing.cpp:40:5)>
               ::_M_manager;
    local_30 = this;
    Logger::log(__x);
    if (local_20 != (code *)0x0) {
      (*local_20)(&local_30,&local_30,3);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  pcVar1 = (this->description)._M_dataplus._M_p;
  paVar3 = &(this->description).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar3) {
    operator_delete(pcVar1,paVar3->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ScopedTimer::~ScopedTimer()
{
    SOUL_LOG (description, [&] { return getElapsedTimeDescription(); });
}